

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O3

void __thiscall
helics::MessageFederateManager::MessageFederateManager
          (MessageFederateManager *this,Core *coreOb,MessageFederate *fed,LocalFederateId fedid,
          bool singleThreaded)

{
  bool bVar1;
  
  bVar1 = !singleThreaded;
  (this->mLocalEndpoints).m_obj.dataStorage.csize = 0;
  (this->mLocalEndpoints).m_obj.dataStorage.dataptr = (Endpoint **)0x0;
  (this->mLocalEndpoints).m_obj.dataStorage.dataSlotsAvailable = 0;
  (this->mLocalEndpoints).m_obj.dataStorage.dataSlotIndex = 0;
  (this->mLocalEndpoints).m_obj.dataStorage.bsize = 0x20;
  (this->mLocalEndpoints).m_obj.dataStorage.freeSlotsAvailable = 0;
  (this->mLocalEndpoints).m_obj.dataStorage.freeIndex = 0;
  (this->mLocalEndpoints).m_obj.dataStorage.freeblocks = (Endpoint **)0x0;
  (this->mLocalEndpoints).m_obj.lookup1._M_h._M_buckets =
       &(this->mLocalEndpoints).m_obj.lookup1._M_h._M_single_bucket;
  (this->mLocalEndpoints).m_obj.lookup1._M_h._M_bucket_count = 1;
  (this->mLocalEndpoints).m_obj.lookup1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mLocalEndpoints).m_obj.lookup1._M_h._M_element_count = 0;
  (this->mLocalEndpoints).m_obj.lookup1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mLocalEndpoints).m_obj.lookup1._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mLocalEndpoints).m_obj.lookup1._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mLocalEndpoints).m_obj.names.csize = 0;
  (this->mLocalEndpoints).m_obj.names.dataptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->mLocalEndpoints).m_obj.names.dataSlotsAvailable = 0;
  (this->mLocalEndpoints).m_obj.names.dataSlotIndex = 0;
  (this->mLocalEndpoints).m_obj.names.bsize = 0x20;
  (this->mLocalEndpoints).m_obj.names.freeSlotsAvailable = 0;
  (this->mLocalEndpoints).m_obj.names.freeIndex = 0;
  (this->mLocalEndpoints).m_obj.names.freeblocks =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->mLocalEndpoints).m_obj.lookup2._M_h._M_buckets =
       &(this->mLocalEndpoints).m_obj.lookup2._M_h._M_single_bucket;
  (this->mLocalEndpoints).m_obj.lookup2._M_h._M_bucket_count = 1;
  (this->mLocalEndpoints).m_obj.lookup2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mLocalEndpoints).m_obj.lookup2._M_h._M_element_count = 0;
  (this->mLocalEndpoints).m_obj.lookup2._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&(this->mLocalEndpoints).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  *(undefined8 *)((long)&(this->mLocalEndpoints).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->mLocalEndpoints).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->mLocalEndpoints).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->mLocalEndpoints).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  (this->mLocalEndpoints).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->mLocalEndpoints).m_mutex._M_impl._M_rwlock + 8) = 0;
  (this->mLocalEndpoints).m_obj.lookup2._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mLocalEndpoints).m_obj.lookup2._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mLocalEndpoints).enabled = bVar1;
  *(undefined8 *)&(this->allCallback).m_obj.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->allCallback).m_obj.super__Function_base._M_functor + 8) = 0;
  (this->allCallback).m_obj.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->allCallback).m_obj._M_invoker = (_Invoker_type)0x0;
  (this->allCallback).m_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->allCallback).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->allCallback).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->allCallback).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->allCallback).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->CurrentTime).internalTimeCode = -0x7fffffffffffffff;
  this->coreObject = coreOb;
  this->mFed = fed;
  (this->fedID).fid = fedid.fid;
  (this->eptData).m_obj.
  super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->eptData).m_obj.
  super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->eptData).m_obj.
  super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->eptData).m_obj.
  super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->eptData).m_obj.
  super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->eptData).m_obj.
  super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->eptData).m_obj.
  super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->eptData).m_obj.
  super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->eptData).m_obj.
  super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->eptData).m_obj.
  super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ::_M_initialize_map((_Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
                       *)&this->eptData,0);
  *(undefined8 *)((long)&(this->eptData).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->eptData).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->eptData).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->eptData).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  (this->eptData).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->eptData).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->eptData).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  (this->eptData).enabled = bVar1;
  (this->messageOrder).m_obj.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->messageOrder).m_obj.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->messageOrder).m_obj.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->messageOrder).m_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->messageOrder).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->messageOrder).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->messageOrder).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->messageOrder).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->messageOrder).enabled = bVar1;
  return;
}

Assistant:

MessageFederateManager::MessageFederateManager(Core* coreOb,
                                               MessageFederate* fed,
                                               LocalFederateId fedid,
                                               bool singleThreaded):
    mLocalEndpoints(!singleThreaded), coreObject(coreOb), mFed(fed), fedID(fedid),
    eptData(!singleThreaded), messageOrder(!singleThreaded)
{
}